

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* GetWords(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,string *content)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  anon_class_16_2_c7b4358f Add;
  string delimiters;
  string standalone;
  string currentWord;
  anon_class_16_2_c7b4358f local_a0;
  long local_90;
  long local_88;
  long local_70;
  long local_68;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,"{}:;()[],<>",(allocator *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"\t\n ",(allocator *)&local_50);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_a0);
  pcVar5 = (content->_M_dataplus)._M_p;
  pcVar4 = pcVar5 + content->_M_string_length;
  local_a0.currentWord = &local_50;
  local_a0.words = __return_storage_ptr__;
LAB_00108051:
  if (pcVar5 == pcVar4) {
    GetWords::anon_class_16_2_c7b4358f::operator()(&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    return __return_storage_ptr__;
  }
  cVar2 = *pcVar5;
  lVar3 = 0;
  do {
    if (local_68 == lVar3) {
      lVar3 = 0;
      goto LAB_0010809a;
    }
    pcVar1 = (char *)(local_70 + lVar3);
    lVar3 = lVar3 + 1;
  } while (*pcVar1 != cVar2);
  GetWords::anon_class_16_2_c7b4358f::operator()(&local_a0);
  std::__cxx11::string::operator=((string *)&local_50,cVar2);
  goto LAB_001080ab;
  while (pcVar1 = (char *)(local_90 + lVar3), lVar3 = lVar3 + 1, *pcVar1 != cVar2) {
LAB_0010809a:
    if (local_88 == lVar3) {
      std::__cxx11::string::push_back((char)&local_50);
      goto LAB_001080bf;
    }
  }
LAB_001080ab:
  GetWords::anon_class_16_2_c7b4358f::operator()(&local_a0);
LAB_001080bf:
  pcVar5 = pcVar5 + 1;
  goto LAB_00108051;
}

Assistant:

std::vector<std::string> GetWords(const std::string &content) {
    std::string standalone = "{}:;()[],<>";
    auto IsStandalone = [&](char c) {
        for (char itr : standalone) {
            if (itr == c) {
                return true;
            }
        }
        return false;
    };


    std::string delimiters = "\t\n ";
    auto IsDelimiter = [&](char c) {
        for (char itr : delimiters) {
            if (itr == c) {
                return true;
            }
        }
        return false;
    };

    std::vector<std::string> words;
    std::string currentWord = "";
    auto Add = [&]() {
        if (currentWord.size() == 0) {
            return;
        }
        words.push_back(currentWord);
        currentWord = "";
    };


    for (char itr : content) {
        if (IsStandalone(itr)) {
            Add();
            currentWord = itr;
            Add();
        } else if (IsDelimiter(itr)) {
            Add();
        } else {
            currentWord += itr;
        }
    }

    Add();

    return words;
}